

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O0

void setFitting(Settings *s,Data *d)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  int iVar5;
  reference pdVar6;
  iterator __first;
  iterator __last;
  ostream *poVar7;
  void *pvVar8;
  double dVar9;
  double dVar10;
  __type _Var11;
  __type _Var12;
  double lenavgpix;
  double dify;
  double difx;
  double dify_4;
  double difx_4;
  double avgy_3;
  double difx_3;
  double dify_3;
  double avgy_2;
  double avgx;
  double dify_2;
  double difx_2;
  double avgy_1;
  double dify_1;
  double difx_1;
  double avgy;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_98;
  double *local_90;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_80;
  double *local_78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_68;
  double *local_60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  double *local_48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_38;
  double *local_30;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_20;
  Data *local_18;
  Data *d_local;
  Settings *s_local;
  
  local_18 = d;
  d_local = (Data *)s;
  if ((s->fit & 1U) != 0) {
    local_28._M_current = (double *)std::begin<std::vector<double,std::allocator<double>>>(&d->lons)
    ;
    local_30 = (double *)std::end<std::vector<double,std::allocator<double>>>(&local_18->lons);
    local_20 = std::
               min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                         (local_28,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                    )local_30);
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_20);
    (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*pdVar6;
    local_40._M_current =
         (double *)std::begin<std::vector<double,std::allocator<double>>>(&local_18->lons);
    local_48 = (double *)std::end<std::vector<double,std::allocator<double>>>(&local_18->lons);
    local_38 = std::
               max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                         (local_40,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                    )local_48);
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_38);
    (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*pdVar6;
    local_58._M_current =
         (double *)std::begin<std::vector<double,std::allocator<double>>>(&local_18->lats);
    local_60 = (double *)std::end<std::vector<double,std::allocator<double>>>(&local_18->lats);
    local_50 = std::
               min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                         (local_58,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                    )local_60);
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_50);
    (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar6;
    local_70._M_current =
         (double *)std::begin<std::vector<double,std::allocator<double>>>(&local_18->lats);
    local_78 = (double *)std::end<std::vector<double,std::allocator<double>>>(&local_18->lats);
    local_68 = std::
               max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                         (local_70,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                    )local_78);
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_68);
    (d_local->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*pdVar6;
    if (*(int *)&d_local[2].iEndSeg.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage != 2) {
      local_88._M_current =
           (double *)std::begin<std::vector<double,std::allocator<double>>>(&local_18->scas);
      local_90 = (double *)std::end<std::vector<double,std::allocator<double>>>(&local_18->scas);
      local_80 = std::
                 min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                           (local_88,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                      )local_90);
      pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_80);
      (d_local->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)*pdVar6;
      __first = std::begin<std::vector<double,std::allocator<double>>>(&local_18->scas);
      __last = std::end<std::vector<double,std::allocator<double>>>(&local_18->scas);
      local_98 = std::
                 max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                           (__first._M_current,__last._M_current);
      pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_98);
      (d_local->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar6;
    }
  }
  if (((ulong)(d_local->gpxs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x100000000000000) != 0) {
    pdVar1 = (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar2 = (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (d_local->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    iVar5 = *(int *)((long)&(d_local->gpxs).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4);
    dVar9 = cos((((double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage +
                 (double)(d_local->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start) * 0.5 * pi) / 180.0);
    *(int *)&(d_local->gpxs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start =
         (int)(((double)iVar5 * dVar9 * ((double)pdVar1 - (double)pdVar2)) /
              ((double)pdVar3 - (double)pdVar4));
  }
  if (((ulong)(d_local->gpxs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) {
    pdVar1 = (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar2 = (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (d_local->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    iVar5 = *(int *)&(d_local->gpxs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    dVar9 = cos((((double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage +
                 (double)(d_local->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start) * 0.5 * pi) / 180.0);
    *(int *)((long)&(d_local->gpxs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4) =
         (int)((((double)iVar5 / dVar9) * ((double)pdVar3 - (double)pdVar4)) /
              ((double)pdVar1 - (double)pdVar2));
  }
  if (((ulong)(d_local->gpxs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x10000000000) != 0) {
    dVar9 = ((double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start +
            (double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) * 0.5;
    pdVar1 = (d_local->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    dVar10 = cos((((double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage +
                  (double)(d_local->lons).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) * 0.5 * pi) / 180.0);
    dVar10 = ((((double)pdVar1 - (double)pdVar2) / dVar10) *
             (double)*(int *)&(d_local->gpxs).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) /
             (double)*(int *)((long)&(d_local->gpxs).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 4);
    (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(dVar10 * -0.5 + dVar9);
    (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(dVar10 * 0.5 + dVar9);
  }
  if (((ulong)(d_local->gpxs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0x1000000000000) != 0) {
    dVar9 = ((double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage +
            (double)(d_local->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start) * 0.5;
    pdVar1 = (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar2 = (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar10 = cos((dVar9 * pi) / 180.0);
    dVar10 = ((dVar10 * (double)*(int *)((long)&(d_local->gpxs).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + 4)) /
             (double)*(int *)&(d_local->gpxs).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) *
             ((double)pdVar1 - (double)pdVar2);
    (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(dVar10 * -0.5 + dVar9);
    (d_local->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(dVar10 * 0.5 + dVar9);
  }
  dVar9 = (double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
          (double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
  dVar10 = (double)(d_local->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start -
           (double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
  (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(-(double)(d_local->eles).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start * dVar9 +
                (double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((double)(d_local->eles).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start * dVar9 +
                (double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish);
  (d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(-(double)(d_local->eles).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start * dVar10 +
                (double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  (d_local->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((double)(d_local->eles).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start * dVar10 +
                (double)(d_local->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  if ((((ulong)(d_local->gpxs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish & 0x100000000000000) != 0) ||
     (((ulong)(d_local->gpxs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0)) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Resizing image to ");
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (poVar7,*(int *)&(d_local->gpxs).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
    poVar7 = std::operator<<(poVar7,", ");
    pvVar8 = (void *)std::ostream::operator<<
                               (poVar7,*(int *)((long)&(d_local->gpxs).
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4));
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  }
  if ((((((ulong)(d_local->gpxs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish & 0x100000000) != 0) ||
       (((ulong)(d_local->gpxs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish & 0x10000000000) != 0)) ||
      (((ulong)(d_local->gpxs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish & 0x1000000000000) != 0)) ||
     ((pdVar1 = (d_local->eles).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start, (double)pdVar1 != 0.0 || (NAN((double)pdVar1)))))
  {
    printBounds((Settings *)d_local);
  }
  if (*(int *)&d_local[2].iEndSeg.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage != 2) {
    poVar7 = std::operator<<((ostream *)&std::cout,"\t");
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (poVar7,(double)(d_local->lons).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish);
    poVar7 = std::operator<<(poVar7," <= scalar <= ");
    pvVar8 = (void *)std::ostream::operator<<
                               (poVar7,(double)(d_local->lons).
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  }
  _Var11 = std::pow<double,int>
                     ((double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                      (double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,2);
  _Var12 = std::pow<double,int>
                     ((double)(d_local->lons).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                      (double)(d_local->lats).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,2);
  dVar9 = sqrt(_Var11 + _Var12);
  _Var11 = std::pow<int,int>(*(int *)&(d_local->gpxs).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,2);
  _Var12 = std::pow<int,int>(*(int *)((long)&(d_local->gpxs).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 4),2);
  dVar10 = sqrt(_Var11 + _Var12);
  (d_local->eles).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(dVar9 / dVar10);
  if (*(int *)&(d_local->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage == 1) {
    dVar9 = getAvgLength((Settings *)d_local,local_18);
    if (0.5 <= dVar9 / (double)*(int *)&(d_local->eles).
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
      *(undefined4 *)
       &(d_local->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = 2;
    }
    else {
      *(undefined4 *)
       &(d_local->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = 0;
    }
  }
  return;
}

Assistant:

void setFitting(Settings& s, Data& d)
{
	// Get the image bounds depending on which input options were
	// specified, and from the zoom level, set the sampling
	// strategy.

	if (s.fit)
	{
		s.minx = *min_element(begin(d.lons), end(d.lons));
		s.maxx = *max_element(begin(d.lons), end(d.lons));
		s.miny = *min_element(begin(d.lats), end(d.lats));
		s.maxy = *max_element(begin(d.lats), end(d.lats));

		if (s.mapType != heat)
		{
			s.mins = *min_element(begin(d.scas), end(d.scas));
			s.maxs = *max_element(begin(d.scas), end(d.scas));
		}
	}

	if (s.fitnx)
	{
		double avgy = 0.5 * (s.miny + s.maxy);
		double difx = s.maxx - s.minx;
		double dify = s.maxy - s.miny;
		s.nx = s.ny * cos(avgy * pi / 180.0) * difx / dify;
	}

	if (s.fitny)
	{
		double avgy = 0.5 * (s.miny + s.maxy);
		double difx = s.maxx - s.minx;
		double dify = s.maxy - s.miny;
		s.ny = s.nx / cos(avgy * pi / 180.0) * dify / difx;
	}

	if (s.fitx)
	{
		double avgx = 0.5 * (s.minx + s.maxx);
		double avgy = 0.5 * (s.miny + s.maxy);
		double dify = s.maxy - s.miny;
		double difx = dify / cos(avgy * pi / 180.0) * s.nx / s.ny;
		s.minx = avgx - 0.5 * difx;
		s.maxx = avgx + 0.5 * difx;
	}

	if (s.fity)
	{
		double avgy = 0.5 * (s.miny + s.maxy);
		double difx = s.maxx - s.minx;
		double dify = cos(avgy * pi / 180.0) * s.ny / s.nx * difx;
		s.miny = avgy - 0.5 * dify;
		s.maxy = avgy + 0.5 * dify;
	}

	double difx = s.maxx - s.minx;
	double dify = s.maxy - s.miny;
	s.minx -= s.margin * difx;
	s.maxx += s.margin * difx;
	s.miny -= s.margin * dify;
	s.maxy += s.margin * dify;

	if (s.fitnx || s.fitny)
	{
		std::cout << "Resizing image to " << s.nx << ", " << s.ny << std::endl;
	}

	if (s.fit || s.fitx || s.fity || s.margin != 0.0)
		printBounds(s);

	if (s.mapType != heat)
		std::cout << "\t" << s.mins << " <= scalar <= " << s.maxs << std::endl;

	s.degPerPix
			= sqrt(pow(s.maxx - s.minx, 2) + pow(s.maxy - s.miny, 2))
			/ sqrt(pow(s.nx           , 2) + pow(s.ny           , 2));

	if (s.sampling == autosample)
	{
		double lenavgpix = getAvgLength(s, d);
		if (lenavgpix / s.r < 0.5)  // TODO:  this limit depends on kernel type
			s.sampling = pointwise;
		else
			s.sampling = linear;
	}
}